

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderIsolines.cpp
# Opt level: O1

void glcts::TessellationShadersIsolines::checkSecondOuterTessellationLevelEffect
               (_test_result *test_result,GLenum glMaxTessGenLevelToken)

{
  float fVar1;
  float fVar2;
  pointer pfVar3;
  float *pfVar4;
  bool bVar5;
  int iVar6;
  deUint32 err;
  undefined4 extraout_var;
  TestError *this;
  float *pfVar7;
  bool bVar8;
  bool bVar9;
  long lVar10;
  uint uVar11;
  float fVar12;
  float fVar13;
  float outer_tess_levels1_clamped_rounded;
  GLint gl_max_tess_gen_level_value;
  _line_segments found_line_segments;
  float local_1d0;
  GLint local_1cc;
  float *local_1c8;
  float *pfStack_1c0;
  long local_1b8;
  undefined1 local_1b0 [8];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1c8 = (float *)0x0;
  pfStack_1c0 = (float *)0x0;
  local_1b8 = 0;
  iVar6 = (*((test_result->parent->parent->super_TestCaseBase).m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  local_1cc = 0;
  local_1d0 = 0.0;
  if (test_result->n_vertices != 0) {
    (**(code **)(CONCAT44(extraout_var,iVar6) + 0x868))(glMaxTessGenLevelToken,&local_1cc);
    err = (**(code **)(CONCAT44(extraout_var,iVar6) + 0x800))();
    glu::checkError(err,"glGetIntegerv() failed for GL_MAX_TESS_GEN_LEVEL_EXT pname",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderIsolines.cpp"
                    ,0xfa);
    TessellationShaderUtils::getTessellationLevelAfterVertexSpacing
              (test_result->parent->vertex_spacing_mode,test_result->parent->outer_tess_levels[1],
               local_1cc,(float *)0x0,&local_1d0);
    lVar10 = (long)local_1d0;
    if (test_result->n_vertices != 0) {
      uVar11 = 0;
      do {
        pfVar3 = (test_result->rendered_data).super__Vector_base<float,_std::allocator<float>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        fVar1 = pfVar3[uVar11 * 3];
        fVar2 = pfVar3[uVar11 * 3 + 3];
        if (local_1c8 == pfStack_1c0) {
LAB_00d3f650:
          local_1b0._4_4_ = fVar2;
          local_1b0._0_4_ = fVar1;
          std::vector<std::pair<float,float>,std::allocator<std::pair<float,float>>>::
          emplace_back<std::pair<float,float>>
                    ((vector<std::pair<float,float>,std::allocator<std::pair<float,float>>> *)
                     &local_1c8,(pair<float,_float> *)local_1b0);
        }
        else {
          pfVar4 = local_1c8;
          bVar8 = false;
          do {
            pfVar7 = pfVar4 + 2;
            fVar12 = *pfVar4 - fVar1;
            fVar13 = -fVar12;
            if (-fVar12 <= fVar12) {
              fVar13 = fVar12;
            }
            if (1e-05 <= fVar13) {
LAB_00d3f633:
              bVar5 = false;
              bVar9 = bVar8;
            }
            else {
              fVar12 = pfVar4[1] - fVar2;
              fVar13 = -fVar12;
              if (-fVar12 <= fVar12) {
                fVar13 = fVar12;
              }
              bVar5 = true;
              bVar9 = true;
              if (1e-05 <= fVar13) goto LAB_00d3f633;
            }
          } while ((!bVar5) && (pfVar4 = pfVar7, bVar8 = bVar9, pfVar7 != pfStack_1c0));
          if (!bVar9) goto LAB_00d3f650;
        }
        uVar11 = uVar11 + 2;
      } while (uVar11 < test_result->n_vertices);
    }
    if ((int)lVar10 != (int)((ulong)((long)pfStack_1c0 - (long)local_1c8) >> 3)) {
      local_1b0 = (undefined1  [8])
                  ((test_result->parent->parent->super_TestCaseBase).super_TestCase.super_TestNode.
                  m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "Tessellator generated an invalid amount of unique line segments:",0x40);
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8," instead of the expected amount:",0x20);
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8," for the following inner tessellation level configuration:",
                 0x3a);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," (",2);
      std::ostream::_M_insert<double>((double)test_result->parent->inner_tess_levels[0]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
      std::ostream::_M_insert<double>((double)test_result->parent->inner_tess_levels[1]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,")",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8," and the following outer tesellation level configuration:",
                 0x39);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," (",2);
      std::ostream::_M_insert<double>((double)test_result->parent->outer_tess_levels[0]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
      std::ostream::_M_insert<double>((double)test_result->parent->outer_tess_levels[1]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
      std::ostream::_M_insert<double>((double)test_result->parent->outer_tess_levels[2]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
      std::ostream::_M_insert<double>((double)test_result->parent->outer_tess_levels[3]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,")",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8," and the following vertex spacing mode: ",0x28);
      std::ostream::operator<<(local_1a8,test_result->parent->vertex_spacing_mode);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      this = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this,"Invalid amount of unique line segments generated by tessellator",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderIsolines.cpp"
                 ,0x136);
      __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  if (local_1c8 != (float *)0x0) {
    operator_delete(local_1c8,local_1b8 - (long)local_1c8);
  }
  return;
}

Assistant:

void TessellationShadersIsolines::checkSecondOuterTessellationLevelEffect(_test_result&		test_result,
																		  const glw::GLenum glMaxTessGenLevelToken)
{
	typedef float _line_segment_x;
	typedef std::pair<_line_segment_x, _line_segment_x> _line_segment;
	typedef std::vector<_line_segment> _line_segments;
	typedef _line_segments::iterator   _line_segments_iterator;

	glcts::Context&		  context = test_result.parent->parent->getContext();
	const float			  epsilon = 1e-5f;
	_line_segments		  found_line_segments;
	const glw::Functions& gl								   = context.getRenderContext().getFunctions();
	glw::GLint			  gl_max_tess_gen_level_value		   = 0;
	float				  outer_tess_levels1_clamped_rounded   = 0.0f;
	unsigned int		  n_line_segments_per_isoline_expected = 0;
	unsigned int		  n_unique_line_segments_found		   = 0;

	if (test_result.n_vertices != 0)
	{
		/* Calculate how many isolines we're expecting */
		gl.getIntegerv(glMaxTessGenLevelToken, &gl_max_tess_gen_level_value);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_TESS_GEN_LEVEL_EXT pname");

		TessellationShaderUtils::getTessellationLevelAfterVertexSpacing(
			test_result.parent->vertex_spacing_mode, test_result.parent->outer_tess_levels[1],
			gl_max_tess_gen_level_value, DE_NULL, /* out_clamped */
			&outer_tess_levels1_clamped_rounded);

		n_line_segments_per_isoline_expected = (unsigned int)outer_tess_levels1_clamped_rounded;

		/* Count unique line segments found in all the line segments making up the result data set.  */
		for (unsigned int n_vertex = 0; n_vertex < test_result.n_vertices;
			 n_vertex += 2 /* vertices per line segment */)
		{
			bool		 was_line_segment_found = false;
			const float* vertex1				= (&test_result.rendered_data[0]) + n_vertex * 3; /* components */
			float		 vertex1_x				= vertex1[0];
			const float* vertex2				= (&test_result.rendered_data[0]) + (n_vertex + 1) * 3; /* components */
			float		 vertex2_x				= vertex2[0];

			for (_line_segments_iterator found_line_segments_iterator = found_line_segments.begin();
				 found_line_segments_iterator != found_line_segments.end(); found_line_segments_iterator++)
			{
				float& found_vertex1_x = found_line_segments_iterator->first;
				float& found_vertex2_x = found_line_segments_iterator->second;

				if (de::abs(found_vertex1_x - vertex1_x) < epsilon && de::abs(found_vertex2_x - vertex2_x) < epsilon)
				{
					was_line_segment_found = true;

					break;
				}
			} /* for (all found Ys) */

			if (!was_line_segment_found)
			{
				found_line_segments.push_back(_line_segment(vertex1_x, vertex2_x));
			}
		} /* for (all vertices) */

		/* Compare the values */
		n_unique_line_segments_found = (unsigned int)found_line_segments.size();

		if (n_unique_line_segments_found != n_line_segments_per_isoline_expected)
		{
			tcu::TestContext& test = test_result.parent->parent->getTestContext();

			test.getLog() << tcu::TestLog::Message << "Tessellator generated an invalid amount of unique line segments:"
						  << n_unique_line_segments_found
						  << " instead of the expected amount:" << n_line_segments_per_isoline_expected
						  << " for the following inner tessellation level configuration:"
						  << " (" << test_result.parent->inner_tess_levels[0] << ", "
						  << test_result.parent->inner_tess_levels[1] << ")"
						  << " and the following outer tesellation level configuration:"
						  << " (" << test_result.parent->outer_tess_levels[0] << ", "
						  << test_result.parent->outer_tess_levels[1] << ", "
						  << test_result.parent->outer_tess_levels[2] << ", "
						  << test_result.parent->outer_tess_levels[3] << ")"
						  << " and the following vertex spacing mode: " << test_result.parent->vertex_spacing_mode
						  << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid amount of unique line segments generated by tessellator");
		}
	} /* if (test_run.n_vertices != 0) */
}